

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O2

void __thiscall Fl_Input_Choice_Type::build_menu(Fl_Input_Choice_Type *this)

{
  int *piVar1;
  Fl_Input_Choice *this_00;
  Fl_Type *pFVar2;
  Fl_Image *pFVar3;
  undefined1 auVar4 [16];
  Fl_Fontsize FVar5;
  int iVar6;
  int iVar7;
  Fl_Menu_Item *pFVar8;
  Fl_Widget *pFVar9;
  char *pcVar10;
  int *piVar11;
  int iVar12;
  ulong uVar13;
  Fl_Type **ppFVar14;
  Fl_Type **ppFVar15;
  
  this_00 = (Fl_Input_Choice *)(this->super_Fl_Menu_Type).super_Fl_Widget_Type.o;
  piVar1 = &(this->super_Fl_Menu_Type).super_Fl_Widget_Type.super_Fl_Type.level;
  iVar12 = 0;
  ppFVar15 = &(this->super_Fl_Menu_Type).super_Fl_Widget_Type.super_Fl_Type.next;
  ppFVar14 = ppFVar15;
  while ((pFVar2 = *ppFVar14, pFVar2 != (Fl_Type *)0x0 && (*piVar1 < pFVar2->level))) {
    iVar6 = (*pFVar2->_vptr_Fl_Type[0x16])(pFVar2);
    iVar12 = (iVar12 - (uint)(iVar6 == 0)) + 2;
    ppFVar14 = &pFVar2->next;
  }
  iVar6 = (this->super_Fl_Menu_Type).menusize;
  if (iVar12 == 0) {
    if ((iVar6 != 0) &&
       (pFVar8 = (this_00->menu_->super_Fl_Menu_Button).super_Fl_Menu_.menu_,
       pFVar8 != (Fl_Menu_Item *)0x0)) {
      operator_delete__(pFVar8);
    }
    Fl_Input_Choice::menu(this_00,(Fl_Menu_Item *)0x0);
    (this->super_Fl_Menu_Type).menusize = 0;
  }
  else {
    if (iVar6 <= iVar12) {
      if ((iVar6 != 0) &&
         (pFVar8 = (this_00->menu_->super_Fl_Menu_Button).super_Fl_Menu_.menu_,
         pFVar8 != (Fl_Menu_Item *)0x0)) {
        operator_delete__(pFVar8);
      }
      (this->super_Fl_Menu_Type).menusize = iVar12 + 0xb;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (long)(iVar12 + 0xb);
      uVar13 = 0xffffffffffffffff;
      if (SUB168(auVar4 * ZEXT816(0x38),8) == 0) {
        uVar13 = SUB168(auVar4 * ZEXT816(0x38),0);
      }
      pFVar8 = (Fl_Menu_Item *)operator_new__(uVar13);
      Fl_Input_Choice::menu(this_00,pFVar8);
    }
    pFVar8 = (this_00->menu_->super_Fl_Menu_Button).super_Fl_Menu_.menu_;
    iVar12 = *piVar1 + 1;
    while ((pFVar2 = *ppFVar15, pFVar2 != (Fl_Type *)0x0 && (*piVar1 < pFVar2->level))) {
      pFVar9 = *(Fl_Widget **)((long)(pFVar2 + 1) + 0x58);
      pFVar3 = (pFVar9->label_).image;
      if (pFVar3 == (Fl_Image *)0x0) {
        pcVar10 = (pFVar9->label_).value;
        if (pcVar10 == (char *)0x0) {
          pcVar10 = "(nolabel)";
        }
        pFVar8->text = pcVar10;
        pFVar8->labeltype_ = (pFVar9->label_).type;
      }
      else {
        (*pFVar3->_vptr_Fl_Image[6])(pFVar3,pFVar8);
        pFVar9 = *(Fl_Widget **)((long)(pFVar2 + 1) + 0x58);
      }
      pFVar8->shortcut_ = *(int *)&pFVar9[1]._vptr_Fl_Widget;
      pFVar8->callback_ = (Fl_Callback *)0x0;
      pFVar8->user_data_ = pFVar2;
      iVar6 = Fl_Menu_Item_Type::flags((Fl_Menu_Item_Type *)pFVar2);
      pFVar8->flags = iVar6;
      pFVar9 = *(Fl_Widget **)((long)(pFVar2 + 1) + 0x58);
      FVar5 = (pFVar9->label_).size;
      pFVar8->labelfont_ = (pFVar9->label_).font;
      pFVar8->labelsize_ = FVar5;
      pFVar8->labelcolor_ = (pFVar9->label_).color;
      iVar7 = (*(((Fl_Widget_Type *)&pFVar2->_vptr_Fl_Type)->super_Fl_Type)._vptr_Fl_Type[0x16])
                        (pFVar2);
      iVar6 = iVar12;
      if (iVar7 != 0) {
        iVar6 = iVar12 + 1;
        *(byte *)&pFVar8->flags = (byte)pFVar8->flags | 0x40;
      }
      ppFVar15 = &pFVar2->next;
      piVar11 = piVar1;
      if (pFVar2->next != (Fl_Type *)0x0) {
        iVar12 = (*pFVar2->next->_vptr_Fl_Type[0x1e])();
        if (iVar12 != 0) {
          piVar11 = &(*ppFVar15)->level;
        }
      }
      iVar12 = *piVar11;
      for (; pFVar8 = pFVar8 + 1, iVar12 < iVar6; iVar6 = iVar6 + -1) {
        pFVar8->text = (char *)0x0;
      }
    }
  }
  Fl_Widget::redraw((this->super_Fl_Menu_Type).super_Fl_Widget_Type.o);
  return;
}

Assistant:

void Fl_Input_Choice_Type::build_menu() {
  Fl_Input_Choice* w = (Fl_Input_Choice*)o;
  // count how many Fl_Menu_Item structures needed:
  int n = 0;
  Fl_Type* q;
  for (q = next; q && q->level > level; q = q->next) {
    if (q->is_parent()) n++; // space for null at end of submenu
    n++;
  }
  if (!n) {
    if (menusize) delete[] (Fl_Menu_Item*)(w->menu());
    w->menu(0);
    menusize = 0;
  } else {
    n++; // space for null at end of menu
    if (menusize<n) {
      if (menusize) delete[] (Fl_Menu_Item*)(w->menu());
      menusize = n+10;
      w->menu(new Fl_Menu_Item[menusize]);
    }
    // fill them all in:
    Fl_Menu_Item* m = (Fl_Menu_Item*)(w->menu());
    int lvl = level+1;
    for (q = next; q && q->level > level; q = q->next) {
      Fl_Menu_Item_Type* i = (Fl_Menu_Item_Type*)q;
      if (i->o->image()) i->o->image()->label(m);
      else {
        m->label(i->o->label() ? i->o->label() : "(nolabel)");
        m->labeltype(i->o->labeltype());
      }
      m->shortcut(((Fl_Button*)(i->o))->shortcut());
      m->callback(0,(void*)i);
      m->flags = i->flags();
      m->labelfont(i->o->labelfont());
      m->labelsize(i->o->labelsize());
      m->labelcolor(i->o->labelcolor());
      if (q->is_parent()) {lvl++; m->flags |= FL_SUBMENU;}
      m++;
      int l1 =
	(q->next && q->next->is_menu_item()) ? q->next->level : level;
      while (lvl > l1) {m->label(0); m++; lvl--;}
      lvl = l1;
    }
  }
  o->redraw();
}